

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,long test_value)

{
  uint uVar1;
  double dVar2;
  long test_value_local;
  Am_Value *this_local;
  
  uVar1 = (uint)this->type;
  if (1 < uVar1 - 2) {
    if (uVar1 == 5) {
      return (this->value).float_value != (float)test_value;
    }
    if (uVar1 != 0x4000) {
      if (uVar1 != 0x8006) {
        return true;
      }
      dVar2 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value)
      ;
      return dVar2 != (double)test_value;
    }
  }
  return (this->value).wrapper_value != (Am_Wrapper *)test_value;
}

Assistant:

bool
Am_Value::operator!=(long test_value) const
{
  switch (type) {
  case Am_LONG:
  case Am_INT:
  case Am_ENUM:
    return value.long_value != test_value;
  case Am_FLOAT:
    return value.float_value != test_value;
  case Am_DOUBLE:
    return (double)*(Am_Double_Data *)value.wrapper_value != test_value;
  default:
    return true;
  }
}